

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

char * ImGui::GetKeyName(ImGuiKey key)

{
  uint uVar1;
  uint uVar2;
  
  if ((key < ImGuiKey_NamedKey_BEGIN) &&
     (key = (GImGui->IO).KeyMap[key], key == ~ImGuiKey_KeysData_OFFSET)) {
    return "N/A";
  }
  if (key == ImGuiKey_KeysData_OFFSET) {
    return "None";
  }
  if ((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
    uVar1 = key - ImGuiKey_ModCtrl >> 0xc;
    uVar2 = key << 0x14 | uVar1;
    if ((uVar2 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
      key = *(ImGuiKey *)(&DAT_002604e0 + (ulong)uVar2 * 4);
    }
  }
  if (key - ImGuiKey_NamedKey_BEGIN < 0x8c) {
    return _ZL9GKeyNames_rel +
           *(int *)(_ZL9GKeyNames_rel + (ulong)(key - ImGuiKey_NamedKey_BEGIN) * 4);
  }
  return "Unknown";
}

Assistant:

inline bool             IsLegacyKey(ImGuiKey key)                                   { return key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_LegacyNativeKey_END; }